

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawCone
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar height,int upAxis,cbtTransform *transform,
          cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  cbtVector3 *pcVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM17 [64];
  undefined1 local_118 [8];
  uint uStack_110;
  undefined1 local_108 [8];
  uint uStack_100;
  undefined1 local_f8 [8];
  uint uStack_f0;
  long local_e8;
  cbtVector3 *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  long local_90;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  fVar1 = (transform->m_origin).m_floats[0];
  uVar23 = 0xffffffe2;
  fVar2 = (transform->m_origin).m_floats[1];
  fVar3 = (transform->m_origin).m_floats[2];
  lVar21 = (long)upAxis;
  _local_f8 = ZEXT812(0);
  register0x0000124c = 0;
  local_e8 = (long)(upAxis + 1 + ((upAxis + 1) / 3) * -3);
  _local_b8 = _local_f8;
  _local_a8 = _local_f8;
  local_90 = lVar21;
  *(cbtScalar *)(local_b8 + local_e8 * 4) = radius;
  *(float *)(local_a8 + lVar21 * 4) = height * 0.5;
  lVar22 = (long)(upAxis + 2 + ((upAxis + 2) / 3) * -3);
  _local_c8 = _local_f8;
  *(cbtScalar *)(local_c8 + lVar22 * 4) = radius;
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar24 = vxorps_avx512vl(ZEXT416((uint)(height * 0.5)),auVar24);
  local_e0 = color;
  *(int *)(local_f8 + lVar21 * 4) = auVar24._0_4_;
  uVar17 = local_a8._0_4_;
  auVar24 = ZEXT416((uint)local_a8._0_4_);
  uVar20 = local_a8._4_4_;
  auVar28 = ZEXT416((uint)local_a8._4_4_);
  fVar15 = fStack_a0;
  auVar30 = ZEXT416((uint)fStack_a0);
  do {
    uVar23 = uVar23 + 0x1e;
    auVar27 = vcvtsi2ss_avx512f(in_ZMM17._0_16_,uVar23);
    fVar29 = auVar27._0_4_ * 0.017453292;
    local_d8._0_4_ = fVar29;
    fVar29 = sinf(fVar29);
    *(float *)(local_f8 + local_e8 * 4) = fVar29 * radius;
    fVar29 = cosf((float)local_d8._0_4_);
    pcVar16 = local_e0;
    *(float *)(local_f8 + lVar22 * 4) = fVar29 * radius;
    fVar29 = (transform->m_basis).m_el[0].m_floats[1];
    fVar4 = (transform->m_basis).m_el[1].m_floats[1];
    fVar5 = (transform->m_basis).m_el[2].m_floats[1];
    auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),auVar31,auVar24);
    auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),auVar33,auVar24);
    auVar36 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar5)),auVar36,auVar24);
    auVar32 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
    auVar27 = vfmadd231ss_fma(auVar27,auVar32,auVar30);
    auVar35 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
    auVar26 = vfmadd231ss_fma(auVar26,auVar35,auVar30);
    auVar37 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
    auVar25 = vfmadd231ss_avx512f(auVar25,auVar37,auVar30);
    auVar27 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar27._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
    _local_108 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
    auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)local_f8._4_4_ * fVar29)),
                              ZEXT416((uint)local_f8._0_4_),auVar31);
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)local_f8._4_4_ * fVar4)),
                              ZEXT416((uint)local_f8._0_4_),auVar33);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_f8._4_4_)),auVar36,
                              ZEXT416((uint)local_f8._0_4_));
    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416(uStack_f0),auVar32);
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(uStack_f0),auVar35);
    auVar25 = vfmadd231ss_avx512f(auVar25,auVar37,ZEXT416(uStack_f0));
    auVar27 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar27._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
    _local_118 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_108,local_118,pcVar16);
    pcVar16 = local_e0;
  } while (uVar23 < 0x14a);
  fVar29 = (transform->m_basis).m_el[0].m_floats[1];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),auVar31,auVar24);
  auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),auVar33,auVar24);
  auVar36 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar5)),auVar36,auVar24);
  auVar32 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar27 = vfmadd231ss_fma(auVar27,auVar32,auVar30);
  auVar35 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar26 = vfmadd231ss_fma(auVar26,auVar35,auVar30);
  auVar37 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar25 = vfmadd231ss_fma(auVar25,auVar37,auVar30);
  auVar27 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar27._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar25);
  fVar14 = fStack_b0;
  _local_108 = vinsertps_avx(auVar27,auVar26,0x28);
  fVar12 = fStack_b0 - fVar15;
  local_d8._0_8_ = (ulong)(uint)uVar17 ^ 0x8000000080000000;
  local_d8._8_4_ = 0x80000000;
  local_d8._12_4_ = 0x80000000;
  local_78 = -(float)uVar20;
  uStack_74 = 0x80000000;
  uStack_70 = 0x80000000;
  uStack_6c = 0x80000000;
  local_88._0_8_ = (ulong)(uint)fVar15 ^ 0x8000000080000000;
  local_88._8_4_ = 0x80000000;
  local_88._12_4_ = 0x80000000;
  uVar19 = local_b8._4_4_;
  uVar18 = local_b8._0_4_;
  fVar34 = (float)local_b8._4_4_ - (float)uVar20;
  fVar13 = (float)local_b8._0_4_ - (float)uVar17;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar34)),ZEXT416((uint)fVar13),auVar31);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar34)),ZEXT416((uint)fVar13),auVar33);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar12),auVar32);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar34)),auVar36,ZEXT416((uint)fVar13));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar12),auVar35);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar27);
  auVar25 = vfmadd231ss_fma(auVar25,auVar37,ZEXT416((uint)fVar12));
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar26);
  auVar27 = vinsertps_avx(auVar27,auVar26,0x10);
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar25);
  _local_118 = vinsertps_avx(auVar27,auVar26,0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_108,local_118,local_e0);
  fVar29 = (transform->m_basis).m_el[0].m_floats[1];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),auVar31,auVar24);
  auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),auVar33,auVar24);
  auVar36 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar5)),auVar36,auVar24);
  auVar32 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar27 = vfmadd231ss_fma(auVar27,auVar32,auVar30);
  auVar35 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar26 = vfmadd231ss_fma(auVar26,auVar35,auVar30);
  auVar37 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar37,auVar30);
  auVar27 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar27._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
  fVar14 = (float)local_88._0_4_ - fVar14;
  _local_108 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
  fVar12 = local_78 - (float)uVar19;
  fVar34 = (float)local_d8._0_4_ - (float)uVar18;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar29)),ZEXT416((uint)fVar34),auVar31);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar4)),ZEXT416((uint)fVar34),auVar33);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar14),auVar32);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar12)),auVar36,ZEXT416((uint)fVar34));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar14),auVar35);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar37,ZEXT416((uint)fVar14));
  auVar27 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar27._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
  _local_118 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_108,local_118,pcVar16);
  fVar29 = (transform->m_basis).m_el[0].m_floats[1];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),auVar31,auVar24);
  auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),auVar33,auVar24);
  auVar36 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar5)),auVar36,auVar24);
  auVar32 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar27 = vfmadd231ss_fma(auVar27,auVar32,auVar30);
  auVar35 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar26 = vfmadd231ss_fma(auVar26,auVar35,auVar30);
  auVar37 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar37,auVar30);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar27);
  auVar27 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
  fVar12 = fStack_c0;
  _local_108 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
  uVar18 = local_c8._4_4_;
  uVar17 = local_c8._0_4_;
  fVar15 = fStack_c0 - fVar15;
  auVar28 = vsubss_avx512f(ZEXT416((uint)local_c8._4_4_),auVar28);
  auVar26 = vsubss_avx512f(ZEXT416((uint)local_c8._0_4_),auVar24);
  fVar34 = auVar28._0_4_;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar34)),auVar26,auVar31);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar34)),auVar26,auVar33);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar15),auVar32);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar34)),auVar36,auVar26);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar15),auVar35);
  auVar28 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar28);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar37,ZEXT416((uint)fVar15));
  auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar2 + auVar27._0_4_)),0x10);
  _local_118 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 + auVar26._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_108,local_118,pcVar16);
  fVar15 = (transform->m_basis).m_el[0].m_floats[1];
  fVar29 = (transform->m_basis).m_el[1].m_floats[1];
  fVar4 = (transform->m_basis).m_el[2].m_floats[1];
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar15)),auVar25,auVar24);
  auVar32 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),auVar32,auVar24);
  auVar35 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),auVar35,auVar24);
  auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar28 = vfmadd231ss_fma(auVar28,auVar31,auVar30);
  auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar27 = vfmadd231ss_fma(auVar27,auVar33,auVar30);
  auVar36 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar36,auVar30);
  auVar28 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar28._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar27._0_4_)),0x10);
  fVar12 = (float)local_88._0_4_ - fVar12;
  _local_108 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 + auVar26._0_4_)),0x28);
  fVar5 = local_78 - (float)uVar18;
  fVar34 = (float)local_d8._0_4_ - (float)uVar17;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar15)),ZEXT416((uint)fVar34),auVar25);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar29)),ZEXT416((uint)fVar34),auVar32);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar12),auVar31);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),auVar35,ZEXT416((uint)fVar34));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar12),auVar33);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar36,ZEXT416((uint)fVar12));
  auVar28 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar28._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar27._0_4_)),0x10);
  _local_118 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar3 + auVar26._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_108,local_118,pcVar16);
  _local_108 = ZEXT816(0);
  _local_118 = ZEXT816(0);
  *(undefined4 *)(local_108 + local_90 * 4) = 0x3f800000;
  *(undefined4 *)(local_118 + local_e8 * 4) = 0x3f800000;
  fVar15 = (transform->m_basis).m_el[0].m_floats[1];
  fVar29 = (transform->m_basis).m_el[1].m_floats[1];
  cVar6 = (transform->m_basis).m_el[2].m_floats[0];
  cVar7 = (transform->m_basis).m_el[0].m_floats[0];
  cVar8 = (transform->m_basis).m_el[2].m_floats[2];
  cVar9 = (transform->m_basis).m_el[0].m_floats[2];
  cVar10 = (transform->m_basis).m_el[1].m_floats[0];
  cVar11 = (transform->m_basis).m_el[1].m_floats[2];
  fVar4 = (transform->m_basis).m_el[2].m_floats[1];
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar15)),ZEXT416((uint)cVar7),auVar24);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar29)),ZEXT416((uint)cVar10),auVar24);
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar9),auVar30);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)cVar11),auVar30);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar20 * fVar4)),ZEXT416((uint)cVar6),auVar24);
  auVar30 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar8),auVar30);
  auVar24 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar28._0_4_)),
                          ZEXT416((uint)(fVar2 - auVar27._0_4_)),0x10);
  local_40 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar3 - auVar30._0_4_)),0x28);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (float)local_108._4_4_)),ZEXT416((uint)cVar7),
                            ZEXT416((uint)local_108._0_4_));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (float)local_108._4_4_)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_108._0_4_));
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_108._4_4_)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)local_108._0_4_));
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar9),ZEXT416(uStack_100));
  auVar27 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)cVar11),ZEXT416(uStack_100));
  auVar28 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar8),ZEXT416(uStack_100));
  auVar24 = vinsertps_avx(auVar24,auVar27,0x10);
  local_50 = vinsertps_avx(auVar24,auVar28,0x28);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)local_118._4_4_ * fVar15)),
                            ZEXT416((uint)local_118._0_4_),ZEXT416((uint)cVar7));
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416(uStack_110),ZEXT416((uint)cVar9));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)local_118._4_4_ * fVar29)),
                            ZEXT416((uint)local_118._0_4_),ZEXT416((uint)cVar10));
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416(uStack_110),ZEXT416((uint)cVar11));
  auVar24 = vinsertps_avx(auVar24,auVar28,0x10);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_118._4_4_)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)local_118._0_4_));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar8),ZEXT416(uStack_110));
  local_60 = vinsertps_avx(auVar24,auVar28,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this);
  return;
}

Assistant:

virtual void drawCone(cbtScalar radius, cbtScalar height, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		int stepDegrees = 30;
		cbtVector3 start = transform.getOrigin();

		cbtVector3 offsetHeight(0, 0, 0);
		cbtScalar halfHeight = height * cbtScalar(0.5);
		offsetHeight[upAxis] = halfHeight;
		cbtVector3 offsetRadius(0, 0, 0);
		offsetRadius[(upAxis + 1) % 3] = radius;
		cbtVector3 offset2Radius(0, 0, 0);
		offset2Radius[(upAxis + 2) % 3] = radius;

		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = -halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * capEnd, color);
		}

		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offset2Radius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offset2Radius), color);

		// Drawing the base of the cone
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, 10.0);
	}